

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

bool Js::InterpreterStackFrame::ShouldDoProfile(FunctionBody *executeFunction)

{
  byte bVar1;
  Utf8SourceInfo *pUVar2;
  ExecutionMode EVar3;
  bool bVar4;
  
  EVar3 = FunctionBody::GetInterpreterExecutionMode(executeFunction,false);
  bVar4 = true;
  if (EVar3 != ProfilingInterpreter) {
    pUVar2 = (executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr
    ;
    bVar1 = pUVar2->field_0xa8;
    if ((byte)((bVar1 & 0x40) >> 6 & (bVar1 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0))
        == 1) {
      bVar4 = DynamicProfileInfo::IsEnabled(executeFunction);
      return bVar4;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool InterpreterStackFrame::ShouldDoProfile(FunctionBody* executeFunction)
    {
#if ENABLE_PROFILE_INFO
        const bool doProfile = executeFunction->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (executeFunction->IsInDebugMode() && DynamicProfileInfo::IsEnabled(executeFunction));
        return doProfile;
#else
        return false;
#endif
    }